

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

QSQLiteDriver * __thiscall QSQLiteDriver::primaryIndex(QSQLiteDriver *this,QString *tablename)

{
  QSqlQuery *query;
  char cVar1;
  QSqlResult *pQVar2;
  bool in_DL;
  long in_FS_OFFSET;
  QSqlQuery q;
  QString local_68;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  query = (QSqlQuery *)(tablename->d).ptr;
  cVar1 = (**(code **)&(tablename->d).d[6].super_QArrayData)(tablename);
  if (cVar1 == '\0') {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (char16_t *)0x0;
    local_48.d.size = 0;
    local_68.d.size = 0;
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char16_t *)0x0;
    QSqlIndex::QSqlIndex((QSqlIndex *)this,&local_48,&local_68);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QSqlResult *)(*(code *)(tablename->d).d[0xc].super_QArrayData.alloc)(tablename);
    QSqlQuery::QSqlQuery((QSqlQuery *)&local_48,pQVar2);
    QSqlQuery::setForwardOnly(SUB81((QSqlQuery *)&local_48,0));
    QSQLiteDriverPrivate::getTableInfo((QSQLiteDriverPrivate *)this,query,&local_48,in_DL);
    QSqlQuery::~QSqlQuery((QSqlQuery *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QSqlIndex QSQLiteDriver::primaryIndex(const QString &tablename) const
{
    Q_D(const QSQLiteDriver);
    if (!isOpen())
        return QSqlIndex();

    QSqlQuery q(createResult());
    q.setForwardOnly(true);
    return d->getTableInfo(q, tablename, true);
}